

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ArrayPtr<const_kj::_::CidrRange> kj::_::exampleAddresses(void)

{
  int iVar1;
  size_t size;
  StringPtr SVar2;
  ArrayPtr<const_kj::_::CidrRange> AVar3;
  
  if (exampleAddresses()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&exampleAddresses()::result);
    if (iVar1 != 0) {
      SVar2 = operator____kj("192.0.2.0/24",0xc);
      CidrRange::CidrRange(exampleAddresses::result,SVar2);
      SVar2 = operator____kj("198.51.100.0/24",0xf);
      CidrRange::CidrRange(exampleAddresses::result + 1,SVar2);
      SVar2 = operator____kj("203.0.113.0/24",0xe);
      CidrRange::CidrRange(exampleAddresses::result + 2,SVar2);
      SVar2 = operator____kj("2001:db8::/32",0xd);
      CidrRange::CidrRange(exampleAddresses::result + 3,SVar2);
      __cxa_guard_release(&exampleAddresses()::result);
    }
  }
  size = size<kj::_::CidrRange_const,4ul>(&exampleAddresses::result);
  AVar3 = arrayPtr<kj::_::CidrRange_const>(exampleAddresses::result,size);
  return AVar3;
}

Assistant:

ArrayPtr<const CidrRange> exampleAddresses() {
  static const CidrRange result[] = {
    "192.0.2.0/24"_kj,          // RFC5737 "example address" block 1 -- like example.com for IPs
    "198.51.100.0/24"_kj,       // RFC5737 "example address" block 2 -- like example.com for IPs
    "203.0.113.0/24"_kj,        // RFC5737 "example address" block 3 -- like example.com for IPs
    "2001:db8::/32"_kj,         // RFC3849 "example address" block -- like example.com for IPs
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}